

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ringbuffer_sink.h
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
spdlog::sinks::ringbuffer_sink<std::mutex>::last_formatted_abi_cxx11_
          (ringbuffer_sink<std::mutex> *this,size_t lim)

{
  unsigned_long *puVar1;
  log_msg_buffer *plVar2;
  unsigned_long in_RDX;
  long in_RSI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  memory_buf_t formatted;
  size_t i;
  unsigned_long n_items;
  size_t items_available;
  lock_guard<std::mutex> lock;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *ret;
  value_type *in_stack_fffffffffffffe38;
  lock_guard<std::mutex> *in_stack_fffffffffffffe40;
  basic_memory_buffer<char,_250UL,_std::allocator<char>_> *this_00;
  size_t local_1b8;
  size_type in_stack_fffffffffffffe68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffe70;
  allocator<char> local_171;
  undefined1 local_170 [16];
  basic_memory_buffer<char,_250UL,_std::allocator<char>_> *in_stack_fffffffffffffea0;
  ulong local_50;
  size_t local_28 [2];
  unsigned_long local_18 [3];
  
  local_18[0] = in_RDX;
  std::lock_guard<std::mutex>::lock_guard
            (in_stack_fffffffffffffe40,(mutex_type *)in_stack_fffffffffffffe38);
  local_1b8 = details::circular_q<spdlog::details::log_msg_buffer>::size
                        ((circular_q<spdlog::details::log_msg_buffer> *)(in_RSI + 0x40));
  local_28[0] = local_1b8;
  if (local_18[0] != 0) {
    puVar1 = std::min<unsigned_long>(local_18,local_28);
    local_1b8 = *puVar1;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x186a06);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  for (local_50 = local_28[0] - local_1b8; local_50 < local_28[0]; local_50 = local_50 + 1) {
    this_00 = (basic_memory_buffer<char,_250UL,_std::allocator<char>_> *)&local_171;
    std::allocator<char>::allocator();
    ::fmt::v7::basic_memory_buffer<char,_250UL,_std::allocator<char>_>::basic_memory_buffer
              (this_00,(allocator<char> *)in_stack_fffffffffffffe38);
    std::allocator<char>::~allocator(&local_171);
    in_stack_fffffffffffffe38 =
         (value_type *)
         std::unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_>::operator->
                   ((unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_> *)
                    0x186a80);
    plVar2 = details::circular_q<spdlog::details::log_msg_buffer>::at
                       ((circular_q<spdlog::details::log_msg_buffer> *)this_00,
                        (size_t)in_stack_fffffffffffffe38);
    (**(_func_int **)((long)(in_stack_fffffffffffffe38->_M_dataplus)._M_p + 0x10))
              (in_stack_fffffffffffffe38,plVar2,local_170);
    ::fmt::v7::to_string<char,250ul>(in_stack_fffffffffffffea0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)this_00,in_stack_fffffffffffffe38);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
    ::fmt::v7::basic_memory_buffer<char,_250UL,_std::allocator<char>_>::~basic_memory_buffer
              (this_00);
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x186ba2);
  return in_RDI;
}

Assistant:

std::vector<std::string> last_formatted(size_t lim = 0)
    {
        std::lock_guard<Mutex> lock(base_sink<Mutex>::mutex_);
        auto items_available = q_.size();
        auto n_items = lim > 0 ? (std::min)(lim, items_available) : items_available;
        std::vector<std::string> ret;
        ret.reserve(n_items);
        for (size_t i = (items_available - n_items); i < items_available; i++)
        {
            memory_buf_t formatted;
            base_sink<Mutex>::formatter_->format(q_.at(i), formatted);
            ret.push_back(fmt::to_string(formatted));
        }
        return ret;
    }